

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetAutoVacuum(Btree *p,int autoVacuum)

{
  BtShared *pBVar1;
  uint uVar2;
  int iVar3;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  uVar2 = autoVacuum & 0xff;
  if (((pBVar1->btsFlags & 2) == 0) || ((bool)pBVar1->autoVacuum == (uVar2 != 0))) {
    pBVar1->autoVacuum = uVar2 != 0;
    pBVar1->incrVacuum = uVar2 == 2;
    iVar3 = 0;
  }
  else {
    iVar3 = 8;
  }
  sqlite3BtreeLeave(p);
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetAutoVacuum(Btree *p, int autoVacuum){
#ifdef SQLITE_OMIT_AUTOVACUUM
  return SQLITE_READONLY;
#else
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;
  u8 av = (u8)autoVacuum;

  sqlite3BtreeEnter(p);
  if( (pBt->btsFlags & BTS_PAGESIZE_FIXED)!=0 && (av ?1:0)!=pBt->autoVacuum ){
    rc = SQLITE_READONLY;
  }else{
    pBt->autoVacuum = av ?1:0;
    pBt->incrVacuum = av==2 ?1:0;
  }
  sqlite3BtreeLeave(p);
  return rc;
#endif
}